

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O1

char ** iniparser_getseckeys(dictionary *d,char *s,char **keys)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  char keym [1025];
  char local_438 [1032];
  
  if ((keys == (char **)0x0 || d == (dictionary *)0x0) ||
     (pcVar3 = iniparser_getstring(d,s,(char *)0xffffffffffffffff),
     pcVar3 == (char *)0xffffffffffffffff)) {
    keys = (char **)0x0;
  }
  else {
    sVar4 = strlen(s);
    strlwc(s,local_438,0x401);
    local_438[(int)sVar4] = ':';
    lVar1 = d->size;
    if (0 < lVar1) {
      lVar6 = 0;
      iVar5 = 0;
      do {
        pcVar3 = d->key[lVar6];
        if ((pcVar3 != (char *)0x0) &&
           (iVar2 = strncmp(pcVar3,local_438,(long)((sVar4 << 0x20) + 0x100000000) >> 0x20),
           iVar2 == 0)) {
          keys[iVar5] = pcVar3;
          iVar5 = iVar5 + 1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar1 != lVar6);
    }
  }
  return keys;
}

Assistant:

const char ** iniparser_getseckeys(const dictionary * d, const char * s, const char ** keys)
{
    int i, j, seclen ;
    char keym[ASCIILINESZ + 1];

    if (d == NULL || keys == NULL) return NULL;
    if (! iniparser_find_entry(d, s)) return NULL;

    seclen  = (int)strlen(s);
    strlwc(s, keym, sizeof(keym));
    keym[seclen] = ':';

    i = 0;

    for (j = 0 ; j < d->size ; j++) {
        if (d->key[j] == NULL)
            continue ;
        if (!strncmp(d->key[j], keym, seclen + 1)) {
            keys[i] = d->key[j];
            i++;
        }
    }

    return keys;
}